

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Initialize(ImGuiContext *context)

{
  ImGuiViewportP *this;
  byte local_7d;
  ImGuiViewportP *local_68;
  ImGuiViewportP *viewport;
  ImGuiSettingsHandler ini_handler;
  ImGuiContext *g;
  ImGuiContext *context_local;
  
  local_7d = 0;
  if ((context->Initialized & 1U) == 0) {
    local_7d = context->SettingsLoaded ^ 0xff;
  }
  ini_handler.UserData = context;
  if ((local_7d & 1) == 0) {
    __assert_fail("!g.Initialized && !g.SettingsLoaded",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1152,"void ImGui::Initialize(ImGuiContext *)");
  }
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)&viewport);
  viewport = (ImGuiViewportP *)0x201b1c;
  ini_handler.TypeName._0_4_ = ImHashStr("Window",0,0);
  ini_handler._8_8_ = WindowSettingsHandler_ClearAll;
  ini_handler.ReadInitFn = WindowSettingsHandler_ReadOpen;
  ini_handler.ReadOpenFn = WindowSettingsHandler_ReadLine;
  ini_handler.ReadLineFn = WindowSettingsHandler_ApplyAll;
  ini_handler.ApplyAllFn = WindowSettingsHandler_WriteAll;
  ImVector<ImGuiSettingsHandler>::push_back
            ((ImVector<ImGuiSettingsHandler> *)((long)ini_handler.UserData + 0x5310),
             (ImGuiSettingsHandler *)&viewport);
  TableSettingsInstallHandler(context);
  MemAlloc(0xb8);
  this = (ImGuiViewportP *)operator_new(0xb8);
  ImGuiViewportP::ImGuiViewportP(this);
  local_68 = this;
  ImVector<ImGuiViewportP_*>::push_back
            ((ImVector<ImGuiViewportP_*> *)((long)ini_handler.UserData + 0x4028),&local_68);
  *(undefined1 *)ini_handler.UserData = 1;
  return;
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

    // Add .ini handle for ImGuiTable type
    TableSettingsInstallHandler(context);

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    g.Viewports.push_back(viewport);

#ifdef IMGUI_HAS_DOCK
#endif

    g.Initialized = true;
}